

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_bignum_add_digits(sexp ctx,sexp dst,sexp a,sexp b)

{
  void *__s;
  long *plVar1;
  ulong uVar2;
  sexp psVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  bool bVar6;
  ulong uVar7;
  undefined1 *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 *puVar12;
  sexp c;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_68;
  void *local_60;
  size_t local_58;
  sexp local_50;
  sexp_gc_var_t local_48;
  
  local_60 = (void *)((long)&a->value + 0x10);
  puVar5 = (undefined1 *)((long)&((a->value).type.cpl)->tag + 2);
  do {
    puVar8 = puVar5;
    if (puVar8 == (undefined1 *)0x3) {
      puVar8 = (undefined1 *)0x1;
      goto LAB_00119f7b;
    }
    puVar5 = puVar8 + -1;
  } while (*(long *)(&a->tag + (long)puVar8 * 2) == 0);
  puVar8 = puVar8 + -2;
LAB_00119f7b:
  puVar5 = (undefined1 *)((long)&((b->value).type.cpl)->tag + 2);
  do {
    puVar12 = puVar5;
    if (puVar12 == (undefined1 *)0x3) {
      puVar12 = (undefined1 *)0x1;
      goto LAB_00119fa2;
    }
    puVar5 = puVar12 + -1;
  } while (*(long *)(&b->tag + (long)puVar12 * 2) == 0);
  puVar12 = puVar12 + -2;
LAB_00119fa2:
  local_68 = (sexp)0x43e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  if (puVar8 < puVar12) {
    psVar3 = sexp_bignum_add_digits(ctx,dst,b,a);
    return psVar3;
  }
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_48;
  if (dst != (sexp)0x0) {
    puVar5 = (undefined1 *)((long)&((dst->value).type.cpl)->tag + 2);
    do {
      puVar4 = puVar5;
      if (puVar4 == (undefined1 *)0x3) {
        puVar4 = (undefined1 *)0x1;
        goto LAB_0011a023;
      }
      puVar5 = puVar4 + -1;
    } while (*(long *)(&dst->tag + (long)puVar4 * 2) == 0);
    puVar4 = puVar4 + -2;
LAB_0011a023:
    local_48.var = &local_68;
    if (puVar8 <= puVar4) goto LAB_0011a099;
  }
  uVar10 = (a->value).string.offset;
  local_58 = uVar10 * 8;
  local_50 = ctx;
  local_48.var = &local_68;
  dst = sexp_alloc_tagged_aux(ctx,uVar10 * 8 + 0x18,0xc);
  (dst->value).string.offset = uVar10;
  uVar2 = (a->value).string.offset;
  if (uVar2 < uVar10) {
    uVar10 = uVar2;
  }
  (dst->value).flonum_bits[0] = (a->value).flonum_bits[0];
  __s = (void *)((long)&dst->value + 0x10);
  memset(__s,0,local_58);
  memmove(__s,local_60,uVar10 << 3);
  ctx = local_50;
LAB_0011a099:
  if (puVar12 == (undefined1 *)0x0) {
    puVar5 = (undefined1 *)0x0;
    bVar6 = false;
  }
  else {
    uVar10 = 0;
    puVar5 = (undefined1 *)0x0;
    do {
      uVar2 = *(ulong *)((long)local_60 + (long)puVar5 * 8);
      uVar7 = *(long *)((long)&b->value + (long)puVar5 * 8 + 0x10) + uVar2;
      *(ulong *)((long)&dst->value + (long)puVar5 * 8 + 0x10) = uVar7 + uVar10;
      uVar9 = ~*(ulong *)((long)&b->value + (long)puVar5 * 8 + 0x10);
      uVar11 = ~uVar10;
      uVar10 = (ulong)(uVar9 < uVar2) + (ulong)(uVar11 < uVar7);
      puVar5 = puVar5 + 1;
    } while (puVar5 < puVar12);
    bVar6 = uVar9 < uVar2 || uVar11 < uVar7;
  }
  if (bVar6) {
    do {
      if (puVar8 <= puVar5) break;
      plVar1 = (long *)((long)&dst->value + (long)puVar5 * 8 + 0x10);
      *plVar1 = *plVar1 + 1;
      bVar6 = *plVar1 == 0;
      puVar5 = puVar5 + 1;
    } while (bVar6);
  }
  local_68 = dst;
  if (bVar6) {
    local_68 = sexp_copy_bignum(ctx,(sexp)0x0,dst,(sexp_uint_t)(puVar8 + 1));
    *(undefined8 *)((long)&local_68->value + (long)puVar8 * 8 + 0x10) = 1;
  }
  (ctx->value).context.saves = local_48.next;
  return local_68;
}

Assistant:

sexp sexp_bignum_add_digits (sexp ctx, sexp dst, sexp a, sexp b) {
  sexp_uint_t alen=sexp_bignum_hi(a), blen=sexp_bignum_hi(b),
    carry=0, i, old_a, p_sum, *adata, *bdata, *cdata;
  sexp_gc_var1(c);
  if (alen < blen) return sexp_bignum_add_digits(ctx, dst, b, a);
  sexp_gc_preserve1(ctx, c);
  c = ((dst && sexp_bignum_hi(dst) >= alen)
       ? dst : sexp_copy_bignum(ctx, NULL, a, 0));
  adata = sexp_bignum_data(a);
  bdata = sexp_bignum_data(b);
  cdata = sexp_bignum_data(c);
  for (i=0; i<blen; i++) {
    old_a = adata[i]; /* adata may alias cdata */
    p_sum = adata[i] + bdata[i];
    cdata[i] = p_sum + carry;
    carry = (old_a > (SEXP_UINT_T_MAX - bdata[i]) ? 1 : 0)
          + (p_sum > (SEXP_UINT_T_MAX - carry) ? 1 : 0);
  }
  for ( ; carry && (i<alen); i++) {
    carry = (cdata[i] == SEXP_UINT_T_MAX ? 1 : 0);
    cdata[i]++;
  }
  if (carry) {
    c = sexp_copy_bignum(ctx, NULL, c, alen+1);
    sexp_bignum_data(c)[alen] = 1;
  }
  sexp_gc_release1(ctx);
  return c;
}